

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O2

uint stbiw__zhash(uchar *data)

{
  uint uVar1;
  
  uVar1 = (uint)*(uint3 *)data * 8 ^ (uint)*(uint3 *)data;
  uVar1 = (uVar1 >> 5) + uVar1;
  uVar1 = uVar1 * 0x10 ^ uVar1;
  uVar1 = (uVar1 >> 0x11) + uVar1;
  uVar1 = uVar1 * 0x2000000 ^ uVar1;
  return (uVar1 >> 6) + uVar1;
}

Assistant:

static unsigned int stbiw__zhash(unsigned char *data)
{
   stbiw_uint32 hash = data[0] + (data[1] << 8) + (data[2] << 16);
   hash ^= hash << 3;
   hash += hash >> 5;
   hash ^= hash << 4;
   hash += hash >> 17;
   hash ^= hash << 25;
   hash += hash >> 6;
   return hash;
}